

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O2

void __thiscall glcts::IntegerConstant::IntegerConstant(IntegerConstant *this,Literals lit,int ai)

{
  _func_int *p_Var1;
  uint uVar2;
  StringStream *this_00;
  ostream *poVar3;
  char *pcVar4;
  string local_1b0 [32];
  StringStream s;
  
  (this->asString)._M_dataplus._M_p = (pointer)&(this->asString).field_2;
  (this->asString)._M_string_length = 0;
  (this->asString).field_2._M_local_buf[0] = '\0';
  this->asInt = ai;
  this_00 = &s;
  StringStream::StringStream(this_00);
  pcVar4 = "0x";
  switch(lit) {
  case decimal:
    goto switchD_00beac3a_caseD_0;
  case decimal_u:
    goto switchD_00beac3a_caseD_1;
  case decimal_U:
    goto switchD_00beac3a_caseD_2;
  case octal:
    this_00 = (StringStream *)std::operator<<((ostream *)&s,"0");
    uVar2 = 0x40;
    break;
  case octal_u:
    this_00 = (StringStream *)std::operator<<((ostream *)&s,"0");
    uVar2 = 0x40;
    goto LAB_00beaca0;
  case octal_U:
    this_00 = (StringStream *)std::operator<<((ostream *)&s,"0");
    uVar2 = 0x40;
    goto LAB_00bead1b;
  case hex_X:
    pcVar4 = "0X";
  case hex_x:
    this_00 = (StringStream *)std::operator<<((ostream *)&s,pcVar4);
    uVar2 = 8;
    break;
  case hex_u_X:
    pcVar4 = "0X";
  case hex_u:
    this_00 = (StringStream *)std::operator<<((ostream *)&s,pcVar4);
    uVar2 = 8;
LAB_00beaca0:
    p_Var1 = (this_00->super_ostringstream).super_basic_ostream<char,_std::char_traits<char>_>.
             _vptr_basic_ostream[-3];
    *(uint *)(&(this_00->super_ostringstream).super_basic_ostream<char,_std::char_traits<char>_>.
               field_0x18 + (long)p_Var1) =
         *(uint *)(&(this_00->super_ostringstream).
                    super_basic_ostream<char,_std::char_traits<char>_>.field_0x18 + (long)p_Var1) &
         0xffffffb5 | uVar2;
switchD_00beac3a_caseD_1:
    poVar3 = (ostream *)std::ostream::operator<<(this_00,this->asInt);
    pcVar4 = "u";
LAB_00bead44:
    std::operator<<(poVar3,pcVar4);
    goto switchD_00beac3a_default;
  case hex_U_X:
    pcVar4 = "0X";
  case hex_U:
    this_00 = (StringStream *)std::operator<<((ostream *)&s,pcVar4);
    uVar2 = 8;
LAB_00bead1b:
    p_Var1 = (this_00->super_ostringstream).super_basic_ostream<char,_std::char_traits<char>_>.
             _vptr_basic_ostream[-3];
    *(uint *)(&(this_00->super_ostringstream).super_basic_ostream<char,_std::char_traits<char>_>.
               field_0x18 + (long)p_Var1) =
         *(uint *)(&(this_00->super_ostringstream).
                    super_basic_ostream<char,_std::char_traits<char>_>.field_0x18 + (long)p_Var1) &
         0xffffffb5 | uVar2;
switchD_00beac3a_caseD_2:
    poVar3 = (ostream *)std::ostream::operator<<(this_00,this->asInt);
    pcVar4 = "U";
    goto LAB_00bead44;
  default:
    goto switchD_00beac3a_default;
  }
  p_Var1 = (this_00->super_ostringstream).super_basic_ostream<char,_std::char_traits<char>_>.
           _vptr_basic_ostream[-3];
  *(uint *)(&(this_00->super_ostringstream).super_basic_ostream<char,_std::char_traits<char>_>.
             field_0x18 + (long)p_Var1) =
       *(uint *)(&(this_00->super_ostringstream).super_basic_ostream<char,_std::char_traits<char>_>.
                  field_0x18 + (long)p_Var1) & 0xffffffb5 | uVar2;
switchD_00beac3a_caseD_0:
  std::ostream::operator<<(this_00,this->asInt);
switchD_00beac3a_default:
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)this,local_1b0);
  std::__cxx11::string::~string(local_1b0);
  StringStream::~StringStream(&s);
  return;
}

Assistant:

IntegerConstant(Literals lit, int ai) : asInt(ai)
	{
		StringStream s;
		switch (lit)
		{
		case decimal:
			s << asInt;
			break;
		case decimal_u:
			s << asInt << "u";
			break;
		case decimal_U:
			s << asInt << "U";
			break;
		case octal:
			s << "0" << std::oct << asInt;
			break;
		case octal_u:
			s << "0" << std::oct << asInt << "u";
			break;
		case octal_U:
			s << "0" << std::oct << asInt << "U";
			break;
		case hex_x:
			s << "0x" << std::hex << asInt;
			break;
		case hex_X:
			s << "0X" << std::hex << asInt;
			break;
		case hex_u:
			s << "0x" << std::hex << asInt << "u";
			break;
		case hex_u_X:
			s << "0X" << std::hex << asInt << "u";
			break;
		case hex_U:
			s << "0x" << std::hex << asInt << "U";
			break;
		case hex_U_X:
			s << "0X" << std::hex << asInt << "U";
			break;
		case last:
		default:
			DE_ASSERT(0);
		}

		asString = s.str();
	}